

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MIL.pb.cc
# Opt level: O0

uint8_t * __thiscall
CoreML::Specification::MILSpec::TensorValue::_InternalSerialize
          (TensorValue *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  bool bVar1;
  int size;
  TensorValue_RepeatedFloats *value;
  TensorValue_RepeatedInts *value_00;
  TensorValue_RepeatedBools *value_01;
  TensorValue_RepeatedStrings *value_02;
  TensorValue_RepeatedLongInts *value_03;
  TensorValue_RepeatedDoubles *value_04;
  uint8_t *puVar2;
  TensorValue_RepeatedBytes *value_05;
  void *data;
  uint32_t cached_has_bits;
  EpsCopyOutputStream *stream_local;
  uint8_t *target_local;
  TensorValue *this_local;
  
  bVar1 = _internal_has_floats(this);
  stream_local = (EpsCopyOutputStream *)target;
  if (bVar1) {
    puVar2 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    value = _Internal::floats(this);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::
                   InternalWriteMessage<CoreML::Specification::MILSpec::TensorValue_RepeatedFloats>
                             (1,value,puVar2,stream);
  }
  bVar1 = _internal_has_ints(this);
  if (bVar1) {
    puVar2 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,(uint8_t *)stream_local);
    value_00 = _Internal::ints(this);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::
                   InternalWriteMessage<CoreML::Specification::MILSpec::TensorValue_RepeatedInts>
                             (2,value_00,puVar2,stream);
  }
  bVar1 = _internal_has_bools(this);
  if (bVar1) {
    puVar2 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,(uint8_t *)stream_local);
    value_01 = _Internal::bools(this);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::
                   InternalWriteMessage<CoreML::Specification::MILSpec::TensorValue_RepeatedBools>
                             (3,value_01,puVar2,stream);
  }
  bVar1 = _internal_has_strings(this);
  if (bVar1) {
    puVar2 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,(uint8_t *)stream_local);
    value_02 = _Internal::strings(this);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::
                   InternalWriteMessage<CoreML::Specification::MILSpec::TensorValue_RepeatedStrings>
                             (4,value_02,puVar2,stream);
  }
  bVar1 = _internal_has_longints(this);
  if (bVar1) {
    puVar2 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,(uint8_t *)stream_local);
    value_03 = _Internal::longints(this);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::
                   InternalWriteMessage<CoreML::Specification::MILSpec::TensorValue_RepeatedLongInts>
                             (5,value_03,puVar2,stream);
  }
  bVar1 = _internal_has_doubles(this);
  if (bVar1) {
    puVar2 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,(uint8_t *)stream_local);
    value_04 = _Internal::doubles(this);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::
                   InternalWriteMessage<CoreML::Specification::MILSpec::TensorValue_RepeatedDoubles>
                             (6,value_04,puVar2,stream);
  }
  bVar1 = _internal_has_bytes(this);
  if (bVar1) {
    puVar2 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,(uint8_t *)stream_local);
    value_05 = _Internal::bytes(this);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::
                   InternalWriteMessage<CoreML::Specification::MILSpec::TensorValue_RepeatedBytes>
                             (7,value_05,puVar2,stream);
  }
  bVar1 = google::protobuf::internal::InternalMetadata::have_unknown_fields
                    (&(this->super_MessageLite)._internal_metadata_);
  if (bVar1) {
    google::protobuf::internal::InternalMetadata::unknown_fields<std::__cxx11::string>
              (&(this->super_MessageLite)._internal_metadata_,
               google::protobuf::internal::GetEmptyString_abi_cxx11_);
    data = (void *)std::__cxx11::string::data();
    google::protobuf::internal::InternalMetadata::unknown_fields<std::__cxx11::string>
              (&(this->super_MessageLite)._internal_metadata_,
               google::protobuf::internal::GetEmptyString_abi_cxx11_);
    size = std::__cxx11::string::size();
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::io::EpsCopyOutputStream::WriteRaw
                             (stream,data,size,(uint8_t *)stream_local);
  }
  return (uint8_t *)stream_local;
}

Assistant:

uint8_t* TensorValue::_InternalSerialize(
    uint8_t* target, ::PROTOBUF_NAMESPACE_ID::io::EpsCopyOutputStream* stream) const {
  // @@protoc_insertion_point(serialize_to_array_start:CoreML.Specification.MILSpec.TensorValue)
  uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  // .CoreML.Specification.MILSpec.TensorValue.RepeatedFloats floats = 1;
  if (_internal_has_floats()) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(
        1, _Internal::floats(this), target, stream);
  }

  // .CoreML.Specification.MILSpec.TensorValue.RepeatedInts ints = 2;
  if (_internal_has_ints()) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(
        2, _Internal::ints(this), target, stream);
  }

  // .CoreML.Specification.MILSpec.TensorValue.RepeatedBools bools = 3;
  if (_internal_has_bools()) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(
        3, _Internal::bools(this), target, stream);
  }

  // .CoreML.Specification.MILSpec.TensorValue.RepeatedStrings strings = 4;
  if (_internal_has_strings()) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(
        4, _Internal::strings(this), target, stream);
  }

  // .CoreML.Specification.MILSpec.TensorValue.RepeatedLongInts longInts = 5;
  if (_internal_has_longints()) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(
        5, _Internal::longints(this), target, stream);
  }

  // .CoreML.Specification.MILSpec.TensorValue.RepeatedDoubles doubles = 6;
  if (_internal_has_doubles()) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(
        6, _Internal::doubles(this), target, stream);
  }

  // .CoreML.Specification.MILSpec.TensorValue.RepeatedBytes bytes = 7;
  if (_internal_has_bytes()) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(
        7, _Internal::bytes(this), target, stream);
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    target = stream->WriteRaw(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).data(),
        static_cast<int>(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size()), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:CoreML.Specification.MILSpec.TensorValue)
  return target;
}